

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMLSession.cpp
# Opt level: O0

void __thiscall
ki::protocol::net::DMLSession::on_application_message(DMLSession *this,PacketHeader *header)

{
  byte bVar1;
  byte bVar2;
  Message *this_00;
  parse_error *e;
  value_error *e_1;
  Message *message;
  InvalidDMLMessageErrorCode error_code;
  PacketHeader *header_local;
  DMLSession *this_local;
  
  this_00 = dml::MessageManager::message_from_binary
                      (this->m_manager,
                       (istream *)(&this->field_0x40 + (long)this->_vptr_DMLSession[-3]));
  if (this_00 == (Message *)0x0) {
    (*this->_vptr_DMLSession[4])(this,0);
  }
  else {
    bVar1 = Session::get_access_level
                      ((Session *)((long)&this->_vptr_DMLSession + (long)this->_vptr_DMLSession[-3])
                      );
    bVar2 = dml::Message::get_access_level(this_00);
    if (bVar1 < bVar2) {
      (*this->_vptr_DMLSession[4])(this,6);
    }
    else {
      (*this->_vptr_DMLSession[3])(this,this_00);
    }
    if (this_00 != (Message *)0x0) {
      dml::Message::~Message(this_00);
      operator_delete(this_00);
    }
  }
  return;
}

Assistant:

void DMLSession::on_application_message(const PacketHeader& header)
	{
		// Attempt to create a Message instance from the data in the stream
		auto error_code = InvalidDMLMessageErrorCode::NONE;
		const dml::Message *message = nullptr;
		try
		{
			message = m_manager.message_from_binary(m_data_stream);
		}
		catch (parse_error &e)
		{
			switch (e.get_error_code())
			{
			case parse_error::INVALID_HEADER_DATA:
				error_code = InvalidDMLMessageErrorCode::INVALID_HEADER_DATA;
				break;
			case parse_error::INSUFFICIENT_MESSAGE_DATA:
			case parse_error::INVALID_MESSAGE_DATA:
				error_code = InvalidDMLMessageErrorCode::INVALID_MESSAGE_DATA;
				break;
			default:
				error_code = InvalidDMLMessageErrorCode::UNKNOWN;
			}
		}
		catch (value_error &e)
		{
			switch (e.get_error_code())
			{
			case value_error::DML_INVALID_SERVICE:
				error_code = InvalidDMLMessageErrorCode::INVALID_SERVICE;
				break;
			case value_error::DML_INVALID_MESSAGE_TYPE:
				error_code = InvalidDMLMessageErrorCode::INVALID_MESSAGE_TYPE;
				break;
			default:
				error_code = InvalidDMLMessageErrorCode::UNKNOWN;
			}
		}

		if (!message)
		{
			on_invalid_message(error_code);
			return;
		}

		// Are we sufficiently authenticated to handle this message?
		if (get_access_level() >= message->get_access_level())
			on_message(message);
		else
			on_invalid_message(InvalidDMLMessageErrorCode::INSUFFICIENT_ACCESS);
		delete message;
	}